

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock(ThreadSafeArena *this,void *buf,size_t size)

{
  size_t sVar1;
  LogMessage *pLVar2;
  undefined1 auVar3 [16];
  LogMessageFatal local_50 [19];
  Voidify local_3d;
  uint local_3c;
  unsigned_long local_38;
  string *local_30;
  string *absl_log_internal_check_op_result;
  size_t size_local;
  void *buf_local;
  ThreadSafeArena *this_local;
  
  absl_log_internal_check_op_result = (string *)size;
  size_local = (size_t)buf;
  buf_local = this;
  local_38 = absl::lts_20240722::log_internal::GetReferenceableValue((ulong)buf & 7);
  local_3c = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_30 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                       (&local_38,&local_3c,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  if (local_30 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/arena.cc"
               ,0x245,auVar3._0_8_,auVar3._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_3d,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  if ((size_local == 0) || (absl_log_internal_check_op_result < (string *)0x11)) {
    this_local = (ThreadSafeArena *)anon_unknown_12::SentryArenaBlock();
  }
  else {
    TaggedAllocationPolicyPtr::set_is_user_owned_initial_block(&this->alloc_policy_,true);
    sVar1 = size_local;
    ArenaBlock::ArenaBlock
              ((ArenaBlock *)size_local,(ArenaBlock *)0x0,(size_t)absl_log_internal_check_op_result)
    ;
    this_local = (ThreadSafeArena *)sVar1;
  }
  return (ArenaBlock *)this_local;
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size) {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);
  if (buf == nullptr || size <= kBlockHeaderSize) {
    return SentryArenaBlock();
  }
  // Record user-owned block.
  alloc_policy_.set_is_user_owned_initial_block(true);
  return new (buf) ArenaBlock{nullptr, size};
}